

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  void *pvVar1;
  bool bVar2;
  undefined8 *in_RDI;
  CleanupNode *next_node;
  CleanupNode *node;
  void *local_10;
  
  *in_RDI = &PTR__Iterator_00160588;
  bVar2 = CleanupNode::IsEmpty((CleanupNode *)(in_RDI + 1));
  if (!bVar2) {
    CleanupNode::Run((CleanupNode *)0x13620c);
    pvVar1 = (void *)in_RDI[4];
    while (local_10 = pvVar1, local_10 != (void *)0x0) {
      CleanupNode::Run((CleanupNode *)0x13622c);
      pvVar1 = *(void **)((long)local_10 + 0x18);
      if (local_10 != (void *)0x0) {
        operator_delete(local_10,0x20);
      }
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
  if (!cleanup_head_.IsEmpty()) {
    cleanup_head_.Run();
    for (CleanupNode* node = cleanup_head_.next; node != nullptr;) {
      node->Run();
      CleanupNode* next_node = node->next;
      delete node;
      node = next_node;
    }
  }
}